

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-4.cpp
# Opt level: O3

void __thiscall Server::_acceptHandler(Server *this,error_code *error,socket_ptr *socket)

{
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  basic_streambuf<std::allocator<char>_> *this_00;
  char *__function;
  string_view delim;
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> local_a0;
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_90;
  streambuf_ptr readBuffer;
  bind_t<void,_boost::_mfi::mf4<void,_Server,_const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>,_boost::_bi::list5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>_>
  local_70;
  basic_streambuf_ref<std::allocator<char>_> local_38;
  
  _accept(this);
  this_00 = (basic_streambuf<std::allocator<char>_> *)operator_new(0x60);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (this_00,0xffffffffffffffff,(allocator<char> *)&local_70);
  boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>::
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>
            ((shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>> *)&readBuffer,this_00);
  s = socket->px;
  if (s == (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            *)0x0) {
    __function = 
    "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp>>::operator*() const [T = boost::asio::basic_stream_socket<boost::asio::ip::tcp>]"
    ;
  }
  else {
    if (readBuffer.px != (element_type *)0x0) {
      local_90.pn.pi_ = (socket->pn).pi_;
      if (local_90.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_90.pn.pi_)->use_count_ = (local_90.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_a0.px = readBuffer.px;
      local_a0.pn.pi_ = readBuffer.pn.pi_;
      if (readBuffer.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (readBuffer.pn.pi_)->use_count_ = (readBuffer.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_90.px = s;
      boost::
      bind<void,Server,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>,Server*,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>>
                (&local_70,(boost *)_readHandler,0,this,boost::asio::placeholders::error,
                 boost::asio::placeholders::bytes_transferred,&local_90,&local_a0);
      local_38.sb_ = readBuffer.px;
      delim._M_str = "\r\n\r\n";
      delim._M_len = 4;
      boost::asio::
      async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::_bi::bind_t<void,boost::_mfi::mf4<void,Server,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::e___<0>>>>>>,boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>>>>>
                (s,&local_38,delim,&local_70,(type *)0x0);
      boost::detail::shared_count::~shared_count
                (&local_70.l_.
                  super_storage5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>
                  .a5_.t_.pn);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&local_70.l_.
                         super_storage5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>
                         .
                         super_storage4<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>_>
                         .a4_.t_ + 8));
      boost::detail::shared_count::~shared_count(&local_a0.pn);
      boost::detail::shared_count::~shared_count(&local_90.pn);
      boost::detail::shared_count::~shared_count(&readBuffer.pn);
      return;
    }
    __function = 
    "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::asio::basic_streambuf<>>::operator*() const [T = boost::asio::basic_streambuf<>]"
    ;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,__function);
}

Assistant:

void _acceptHandler( const boost::system::error_code& error, socket_ptr socket ){
        // Immediately set up another acceptor. Since we are doing things asynchronously this call
        // will not block and we'll be ready to accept the next connection right away.
        _accept();

        // Just like with the synchronous version we are reading the whole message into memory and
        // then sending it off to be parsed. Here we are doing it asynchronously, and like all the
        // other Boost ASIO asynchronous methods that means making sure the socket and buffer remain
        // valid during the operation.
        streambuf_ptr readBuffer( new boost::asio::streambuf );
        boost::asio::async_read_until(
            *socket,
            *readBuffer,
            "\r\n\r\n",
            boost::bind(
                &Server::_readHandler,
                this,
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                socket,
                readBuffer
            )
        );
    }